

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_huffman_decode_int0(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  cram_huffman_code *pcVar2;
  long lVar3;
  
  iVar1 = *out_size;
  if (0 < (long)iVar1) {
    pcVar2 = (c->field_6).huffman.codes;
    lVar3 = 0;
    do {
      *(int32_t *)(out + lVar3 * 4) = pcVar2->symbol;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  return 0;
}

Assistant:

int cram_huffman_decode_int0(cram_slice *slice, cram_codec *c,
			     cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;
    const cram_huffman_code * const codes = c->huffman.codes;

    /* Special case of 0 length codes */
    for (i = 0, n = *out_size; i < n; i++) {
	out_i[i] = codes[0].symbol;
    }
    return 0;
}